

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

void __thiscall
cnpy::NpyArray::NpyArray
          (NpyArray *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *_shape,
          size_t _word_size,bool _fortran_order)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector<char,_std::allocator<char>_> *this_00;
  allocator_type local_51;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> local_50;
  ulong local_40;
  size_t i;
  byte local_21;
  size_t sStack_20;
  bool _fortran_order_local;
  size_t _word_size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *_shape_local;
  NpyArray *this_local;
  
  local_21 = _fortran_order;
  sStack_20 = _word_size;
  _word_size_local = (size_t)_shape;
  _shape_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr(&this->data_holder);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->shape,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)_word_size_local)
  ;
  this->word_size = sStack_20;
  this->fortran_order = (bool)(local_21 & 1);
  this->num_vals = 1;
  local_40 = 0;
  while( true ) {
    uVar3 = local_40;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->shape);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->shape,local_40);
    this->num_vals = *pvVar5 * this->num_vals;
    local_40 = local_40 + 1;
  }
  this_00 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  sVar1 = this->word_size;
  sVar2 = this->num_vals;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_00,sVar2 * sVar1,&local_51);
  std::shared_ptr<std::vector<char,std::allocator<char>>>::
  shared_ptr<std::vector<char,std::allocator<char>>,void>
            ((shared_ptr<std::vector<char,std::allocator<char>>> *)&local_50,this_00);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::operator=
            (&this->data_holder,&local_50);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr(&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

NpyArray(const std::vector<size_t>& _shape, size_t _word_size, bool _fortran_order) :
            shape(_shape), word_size(_word_size), fortran_order(_fortran_order)
        {
            num_vals = 1;
            for(size_t i = 0;i < shape.size();i++) num_vals *= shape[i];
            data_holder = std::shared_ptr<std::vector<char>>(
                new std::vector<char>(num_vals * word_size));
        }